

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O3

Aig_Man_t * generateDisjunctiveTester(Abc_Ntk_t *pNtk,Aig_Man_t *pAig,int combN,int combK)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *vCandidateMonotoneSignals_;
  Aig_Man_t *p;
  size_t sVar6;
  char *__s;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  void *pvVar15;
  int iVar16;
  Aig_Obj_t *p1;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int local_7c;
  ulong local_70;
  
  vCandidateMonotoneSignals_ = findHintOutputs(pNtk);
  if (vCandidateMonotoneSignals_ == (Vec_Int_t *)0x0) {
    puts("\nTraget Signal Set is Empty: Duplicating given AIG");
    local_7c = 0;
  }
  else {
    if ((long)vCandidateMonotoneSignals_->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    local_7c = (vCandidateMonotoneSignals_->pArray[(long)vCandidateMonotoneSignals_->nSize + -1] -
               *vCandidateMonotoneSignals_->pArray) + 1;
  }
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar6 = strlen(pAig->pName);
  __s = (char *)malloc(sVar6 + 5);
  p->pName = __s;
  iVar19 = 0;
  sprintf(__s,"%s_%s",pAig->pName,"nCk");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar17 = 0;
    do {
      if (pAig->vCis->nSize <= lVar17) goto LAB_00639cd1;
      pvVar10 = pAig->vCis->pArray[lVar17];
      pAVar7 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar7;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pAig->nTruePis);
  }
  if (0 < pAig->nRegs) {
    iVar19 = 0;
    do {
      uVar4 = pAig->nTruePis + iVar19;
      if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_00639cd1;
      pvVar10 = pAig->vCis->pArray[uVar4];
      iVar19 = iVar19 + 1;
      pAVar7 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar7;
    } while (iVar19 < pAig->nRegs);
  }
  if (0 < combK) {
    uVar18 = 1;
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      lVar17 = countCombination((long)local_7c,uVar18);
      uVar9 = lVar17 + uVar8;
      uVar18 = uVar18 + 1;
    } while (combK + 1 != uVar18);
    if (0 < (long)uVar9) {
      pvVar10 = malloc(0x10);
      iVar3 = (int)uVar9;
      local_70 = 8;
      if (6 < iVar3 - 1U) {
        local_70 = uVar9 & 0xffffffff;
      }
      *(undefined4 *)((long)pvVar10 + 4) = 0;
      iVar20 = (int)local_70;
      lVar11 = (long)iVar20;
      if (iVar20 == 0) {
        pvVar12 = (void *)0x0;
      }
      else {
        pvVar12 = malloc(lVar11 * 8);
      }
      *(void **)((long)pvVar10 + 8) = pvVar12;
      lVar17 = lVar17 + uVar8;
      lVar21 = 0;
      uVar9 = local_70;
      do {
        pAVar7 = Aig_ObjCreateCi(p);
        iVar16 = (int)uVar9;
        if ((int)lVar21 == iVar16) {
          if (iVar16 < 0x10) {
            if (*(void **)((long)pvVar10 + 8) == (void *)0x0) {
              pvVar12 = malloc(0x80);
            }
            else {
              pvVar12 = realloc(*(void **)((long)pvVar10 + 8),0x80);
            }
            *(void **)((long)pvVar10 + 8) = pvVar12;
            uVar9 = 0x10;
          }
          else {
            uVar9 = (ulong)(uint)(iVar16 * 2);
            if (*(void **)((long)pvVar10 + 8) == (void *)0x0) {
              pvVar12 = malloc(uVar9 * 8);
            }
            else {
              pvVar12 = realloc(*(void **)((long)pvVar10 + 8),uVar9 * 8);
            }
            *(void **)((long)pvVar10 + 8) = pvVar12;
          }
        }
        else {
          pvVar12 = *(void **)((long)pvVar10 + 8);
        }
        lVar1 = lVar21 + 1;
        *(int *)((long)pvVar10 + 4) = (int)lVar21 + 1;
        *(Aig_Obj_t **)((long)pvVar12 + lVar21 * 8) = pAVar7;
        lVar21 = lVar1;
      } while (lVar17 != lVar1);
      pVVar13 = pAig->vObjs;
      if (0 < pVVar13->nSize) {
        lVar21 = 0;
        do {
          pvVar12 = pVVar13->pArray[lVar21];
          if ((pvVar12 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar12 + 0x18) & 7) - 7))
          {
            if (((ulong)pvVar12 & 1) != 0) goto LAB_00639cf0;
            uVar9 = *(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffe;
            if (uVar9 == 0) {
              pAVar7 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar7 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar12 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28))
              ;
            }
            uVar9 = *(ulong *)((long)pvVar12 + 0x10) & 0xfffffffffffffffe;
            if (uVar9 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar12 + 0x10) & 1) ^ *(ulong *)(uVar9 + 0x28));
            }
            pAVar7 = Aig_And(p,pAVar7,p1);
            *(Aig_Obj_t **)((long)pvVar12 + 0x28) = pAVar7;
            pVVar13 = pAig->vObjs;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < pVVar13->nSize);
      }
      pVVar13 = (Vec_Ptr_t *)malloc(0x10);
      pVVar13->nSize = 0;
      pVVar13->nCap = iVar20;
      if (iVar20 == 0) {
        ppvVar14 = (void **)0x0;
      }
      else {
        ppvVar14 = (void **)malloc(lVar11 * 8);
      }
      pVVar13->pArray = ppvVar14;
      if (0 < combK) {
        iVar16 = 1;
        do {
          generateCombinatorialStabil(p,pAig,vCandidateMonotoneSignals_,pVVar13,local_7c,iVar16);
          iVar2 = (1 - combK) + iVar16;
          iVar16 = iVar16 + 1;
        } while (iVar2 != 1);
      }
      pvVar12 = malloc(0x10);
      if (iVar20 == 0) {
        pvVar15 = (void *)0x0;
      }
      else {
        pvVar15 = malloc(lVar11 << 3);
      }
      *(void **)((long)pvVar12 + 8) = pvVar15;
      lVar11 = 0;
      do {
        if (((lVar11 == 0x80000000) || (uVar4 = (uint)lVar11, (int)lVar1 + -1 < (int)uVar4)) ||
           (pVVar13->nSize <= (int)uVar4)) goto LAB_00639cd1;
        pAVar7 = Aig_Or(p,(Aig_Obj_t *)((ulong)pVVar13->pArray[uVar4 & 0x7fffffff] ^ 1),
                        *(Aig_Obj_t **)
                         (*(long *)((long)pvVar10 + 8) + (ulong)(uVar4 & 0x7fffffff) * 8));
        uVar5 = (uint)local_70;
        if (uVar4 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (*(void **)((long)pvVar12 + 8) == (void *)0x0) {
              pvVar15 = malloc(0x80);
            }
            else {
              pvVar15 = realloc(*(void **)((long)pvVar12 + 8),0x80);
            }
            *(void **)((long)pvVar12 + 8) = pvVar15;
            local_70 = 0x10;
          }
          else {
            local_70 = (ulong)(uVar5 * 2);
            if (*(void **)((long)pvVar12 + 8) == (void *)0x0) {
              pvVar15 = malloc(local_70 * 8);
            }
            else {
              pvVar15 = realloc(*(void **)((long)pvVar12 + 8),local_70 * 8);
            }
            *(void **)((long)pvVar12 + 8) = pvVar15;
          }
        }
        else {
          pvVar15 = *(void **)((long)pvVar12 + 8);
        }
        *(Aig_Obj_t **)((long)pvVar15 + lVar11 * 8) = pAVar7;
        lVar11 = lVar11 + 1;
      } while (lVar17 != lVar11);
      if (0 < pAig->nTruePos) {
        lVar21 = 0;
        do {
          if (pAig->vCos->nSize <= lVar21) goto LAB_00639cd1;
          pvVar10 = pAig->vCos->pArray[lVar21];
          if (((ulong)pvVar10 & 1) != 0) goto LAB_00639cf0;
          uVar9 = *(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffe;
          if (uVar9 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar10 + 8) & 1) ^ *(ulong *)(uVar9 + 0x28));
          }
          pAVar7 = Aig_ObjCreateCo(p,pAVar7);
          *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar7;
          lVar21 = lVar21 + 1;
        } while (lVar21 < pAig->nTruePos);
      }
      iVar20 = (int)lVar11 + -1;
      lVar11 = 0;
      do {
        if ((lVar11 == 0x80000000) || (iVar20 < (int)(uint)lVar11)) goto LAB_00639cd1;
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)
                           (*(long *)((long)pvVar12 + 8) + (ulong)((uint)lVar11 & 0x7fffffff) * 8));
        lVar11 = lVar11 + 1;
      } while (lVar17 != lVar11);
      if (pAig->nRegs < 1) {
        iVar16 = 0;
      }
      else {
        iVar16 = 0;
        do {
          uVar4 = pAig->nTruePos + iVar16;
          if (((int)uVar4 < 0) || (pAig->vCos->nSize <= (int)uVar4)) goto LAB_00639cd1;
          pvVar10 = pAig->vCos->pArray[uVar4];
          if (((ulong)pvVar10 & 1) != 0) {
LAB_00639cf0:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar9 = *(ulong *)((long)pvVar10 + 8);
          uVar18 = uVar9 & 0xfffffffffffffffe;
          if (uVar18 == 0) {
            pAVar7 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar9 & 1) ^ *(ulong *)(uVar18 + 0x28));
          }
          iVar16 = iVar16 + 1;
          Aig_ObjCreateCo(p,pAVar7);
        } while (iVar16 < pAig->nRegs);
      }
      lVar11 = 0;
      while ((lVar11 != 0x80000000 && (uVar4 = (uint)lVar11, (int)uVar4 <= iVar20))) {
        lVar11 = lVar11 + 1;
        Aig_ObjCreateCo(p,*(Aig_Obj_t **)
                           (*(long *)((long)pvVar12 + 8) + (ulong)(uVar4 & 0x7fffffff) * 8));
        if (lVar17 == lVar11) {
          if (iVar16 + iVar3 != iVar19 + iVar3) {
            __assert_fail("liCopied + liCreated == loCopied + loCreated",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/combination.c"
                          ,0x136,
                          "Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)"
                         );
          }
          Aig_ManSetRegNum(p,iVar16 + iVar3);
          Aig_ManCleanup(p);
          iVar19 = Aig_ManCheck(p);
          if (iVar19 == 0) {
            __assert_fail("Aig_ManCheck( pNewAig )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/combination.c"
                          ,0x13b,
                          "Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)"
                         );
          }
          return p;
        }
      }
LAB_00639cd1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("lCombinationCount > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/combination.c"
                ,0xde,"Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)");
}

Assistant:

Aig_Man_t *generateDisjunctiveTester( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, int combN, int combK )
{
    //AIG creation related data structure
    Aig_Man_t *pNewAig;
    int piCopied = 0, loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0, poCopied = 0;
    //int i, iElem, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
    int i, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
    int combN_internal, combK_internal; //, targetPoIndex;
    long longI, lCombinationCount;
    //Aig_Obj_t *pObj, *pObjMonoCand, *pObjLO_nCk, *pObjDisj_nCk;
    Aig_Obj_t *pObj, *pObjLO_nCk, *pObjDisj_nCk;
    Vec_Ptr_t *vLO_nCk, *vPODriver_nCk, *vDisj_nCk;
    Vec_Int_t *vCandidateMonotoneSignals;

    extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);
    
    //Knuth's Data Strcuture
    //Vec_Int_t *vC_KNUTH;
    //int i_KNUTH, j_KNUTH, combCounter_KNUTH = 0;

    //Collecting target HINT signals
    vCandidateMonotoneSignals = findHintOutputs(pNtk);
    if( vCandidateMonotoneSignals == NULL )
    {
        printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
        combN_internal = 0;
    }
    else
    {
        //Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
        //    printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
        hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
        hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
        combN_internal = hintSingalEndMarker - hintSingalBeginningMarker + 1;
    }

    //combK_internal = combK;

    //Knuth's Data Structure Initialization
    //vC_KNUTH = Vec_IntAlloc(combK_internal+3);
    //for(i_KNUTH=-1; i_KNUTH<combK_internal; i_KNUTH++)
    //    Vec_IntPush( vC_KNUTH, i_KNUTH );
    //Vec_IntPush( vC_KNUTH, combN_internal );
    //Vec_IntPush( vC_KNUTH, 0 );

    //Standard AIG duplication begins
    //Standard AIG Manager Creation
    pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
    pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_nCk") + 1 );
    sprintf(pNewAig->pName, "%s_%s", pAig->pName, "nCk");
        pNewAig->pSpec = NULL;

    //Standard Mapping of Constant Nodes
    pObj = Aig_ManConst1( pAig );
        pObj->pData = Aig_ManConst1( pNewAig );

    //Standard AIG PI duplication
    Saig_ManForEachPi( pAig, pObj, i )
    {
        piCopied++;
        pObj->pData = Aig_ObjCreateCi(pNewAig);
    }

    //Standard AIG LO duplication
    Saig_ManForEachLo( pAig, pObj, i )
        {
        loCopied++;
        pObj->pData = Aig_ObjCreateCi(pNewAig);
        }

    //nCk LO creation
    lCombinationCount = 0;
    for(combK_internal=1; combK_internal<=combK; combK_internal++)
        lCombinationCount += countCombination( combN_internal, combK_internal );
    assert( lCombinationCount > 0 );
    vLO_nCk = Vec_PtrAlloc(lCombinationCount);
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        loCreated++;
        pObj = Aig_ObjCreateCi(pNewAig);
        Vec_PtrPush( vLO_nCk, pObj );
    }

    //Standard Node duplication
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    
    //nCk specific logic creation (i.e. nCk number of OR gates)
    vDisj_nCk = Vec_PtrAlloc(lCombinationCount);

    

    //while(1)
    //{
    //    //visit combination
    //    //printf("Comb-%3d : ", ++combCounter_KNUTH);
    //    pObjMonoCand = Aig_Not(Aig_ManConst1(pNewAig));
    //    for( i_KNUTH=combK_internal; i_KNUTH>0; i_KNUTH--)
    //    {
    //        //printf("vC[%d] = %d ", i_KNUTH, Vec_IntEntry(vC_KNUTH, i_KNUTH));
    //        targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntEntry(vC_KNUTH, i_KNUTH));
    //        pObj = Aig_ObjChild0Copy(Aig_ManCo( pAig, targetPoIndex ));
    //        pObjMonoCand = Aig_Or( pNewAig, pObj, pObjMonoCand );
    //    }
    //    Vec_PtrPush(vDisj_nCk, pObjMonoCand );
    //    //printf("\n");

    //    j_KNUTH = 1;
    //    while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
    //    {
    //        Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
    //        j_KNUTH = j_KNUTH + 1;
    //    }
    //    if( j_KNUTH > combK_internal ) break;
    //    Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
    //}
    for( combK_internal=1; combK_internal<=combK; combK_internal++ )
        generateCombinatorialStabil( pNewAig, pAig, vCandidateMonotoneSignals,
                vDisj_nCk, combN_internal, combK_internal );


    //creation of implication logic
    vPODriver_nCk = Vec_PtrAlloc(lCombinationCount);
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        pObjLO_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vLO_nCk, longI ));
        pObjDisj_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vDisj_nCk, longI ));

        pObj = Aig_Or( pNewAig, Aig_Not(pObjDisj_nCk), pObjLO_nCk);
        Vec_PtrPush(vPODriver_nCk, pObj);
    }
    
    //Standard PO duplication
    Saig_ManForEachPo( pAig, pObj, i )
    {
        poCopied++;
        pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
    }

    //nCk specific PO creation
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
    }

    //Standard LI duplication
    Saig_ManForEachLi( pAig, pObj, i )
    {
        liCopied++;
        Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
    }

    //nCk specific LI creation
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        liCreated++;
        Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
    }

    //clean-up, book-keeping
    assert( liCopied + liCreated == loCopied + loCreated );    
    nRegCount = loCopied + loCreated;

    Aig_ManSetRegNum( pNewAig, nRegCount );
    Aig_ManCleanup( pNewAig );
    assert( Aig_ManCheck( pNewAig ) );
    
    //Vec_IntFree(vC_KNUTH);    
    return pNewAig;
}